

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::FragmentTextureWorkloadCullCase::genOccludedGeometry
          (ObjectData *__return_storage_ptr__,FragmentTextureWorkloadCullCase *this)

{
  vector<float,_std::allocator<float>_> local_100;
  ProgramSources local_e8;
  FragmentTextureWorkloadCullCase *local_18;
  FragmentTextureWorkloadCullCase *this_local;
  
  local_18 = this;
  this_local = (FragmentTextureWorkloadCullCase *)__return_storage_ptr__;
  Utils::getTextureWorkloadShader();
  Utils::getFullscreenQuad(&local_100,0.8);
  ObjectData::ObjectData(__return_storage_ptr__,&local_e8,&local_100);
  std::vector<float,_std::allocator<float>_>::~vector(&local_100);
  glu::ProgramSources::~ProgramSources(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

virtual ObjectData	genOccludedGeometry					(void) const
	{
		return ObjectData(Utils::getTextureWorkloadShader(), Utils::getFullscreenQuad(0.8f));
	}